

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

bool __thiscall QTextStreamPrivate::getReal(QTextStreamPrivate *this,double *f)

{
  QLocale *this_00;
  long lVar1;
  Data *pDVar2;
  int *piVar3;
  uchar (*pauVar4) [10];
  bool bVar5;
  QChar QVar6;
  char32_t cVar7;
  Category CVar8;
  int iVar9;
  long *plVar10;
  double dVar11;
  storage_type_conflict sVar12;
  uchar (*__return_storage_ptr__) [10];
  ulong uVar13;
  undefined1 uVar14;
  ulong uVar15;
  long *plVar16;
  QString *pQVar17;
  ulong uVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  QStringView s;
  QByteArrayView ba;
  bool ok;
  char buf [128];
  QString local_150;
  QString local_138;
  QString local_120;
  QString local_108;
  QString local_f0;
  QString local_d8;
  QChar local_ba;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__ = (uchar (*) [10])0x0;
  scan(this,(QChar **)0x0,(qsizetype *)0x0,0,NotSpace);
  consumeLastToken(this);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_ba.ucs = L'\0';
  bVar5 = getChar(this,&local_ba);
  uVar18 = 0;
  if (bVar5) {
    this_00 = &this->locale;
    uVar15 = 0;
    uVar18 = 0;
    do {
      if ((ushort)local_ba.ucs < 0x61) {
        uVar19 = 2;
        switch(local_ba.ucs) {
        case L'0':
        case L'1':
        case L'2':
        case L'3':
        case L'4':
        case L'5':
        case L'6':
        case L'7':
        case L'8':
        case L'9':
          break;
        default:
          goto switchD_003025db_caseD_3a;
        case L'A':
switchD_003025db_caseD_41:
          uVar19 = 8;
          break;
        case L'F':
switchD_003025db_caseD_46:
          uVar19 = 7;
          break;
        case L'I':
switchD_003025db_caseD_49:
          uVar19 = 5;
          break;
        case L'N':
switchD_003025db_caseD_4e:
          uVar19 = 6;
          break;
        case L'T':
switchD_003025db_caseD_54:
          uVar19 = 9;
        }
      }
      else {
        if ((ushort)local_ba.ucs < 0x69) {
          if (local_ba.ucs == L'a') goto switchD_003025db_caseD_41;
          if (local_ba.ucs == L'f') goto switchD_003025db_caseD_46;
        }
        else {
          if (local_ba.ucs == L't') goto switchD_003025db_caseD_54;
          if (local_ba.ucs == L'n') goto switchD_003025db_caseD_4e;
          if ((uint)(ushort)local_ba.ucs == L'i') goto switchD_003025db_caseD_49;
        }
switchD_003025db_caseD_3a:
        cVar7 = QChar::toLower((uint)(ushort)local_ba.ucs);
        QLocale::decimalPoint(&local_f0,this_00);
        QString::toLower_helper(&local_d8,&local_f0);
        sVar12 = (storage_type_conflict)cVar7;
        if (local_d8.d.size == 1) {
          __return_storage_ptr__ = (uchar (*) [10])(ulong)(uint)cVar7;
          bVar5 = *local_d8.d.ptr == sVar12;
        }
        else {
          bVar5 = false;
        }
        if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
          }
        }
        piVar3 = (int *)CONCAT71(local_f0.d.d._1_7_,local_f0.d.d._0_1_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT71(local_f0.d.d._1_7_,local_f0.d.d._0_1_),2,0x10);
          }
        }
        uVar19 = 3;
        if (!bVar5) {
          QLocale::exponential(&local_f0,this_00);
          QString::toLower_helper(&local_d8,&local_f0);
          if (local_d8.d.size == 1) {
            __return_storage_ptr__ = (uchar (*) [10])(ulong)(uint)cVar7;
            bVar5 = *local_d8.d.ptr == sVar12;
          }
          else {
            bVar5 = false;
          }
          if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
            }
          }
          piVar3 = (int *)CONCAT71(local_f0.d.d._1_7_,local_f0.d.d._0_1_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT71(local_f0.d.d._1_7_,local_f0.d.d._0_1_),2,0x10);
            }
          }
          uVar19 = 4;
          if (!bVar5) {
            QLocale::negativeSign(&local_f0,this_00);
            QString::toLower_helper(&local_d8,&local_f0);
            __return_storage_ptr__ = (uchar (*) [10])&local_120;
            if (local_d8.d.size == 1) {
              bVar5 = *local_d8.d.ptr == sVar12;
            }
            else {
              bVar5 = false;
            }
            bVar20 = true;
            if (!bVar5) {
              QLocale::positiveSign((QString *)__return_storage_ptr__,this_00);
              QString::toLower_helper(&local_108,&local_120);
              if (local_108.d.size == 1) {
                __return_storage_ptr__ = (uchar (*) [10])(ulong)(uint)cVar7;
                bVar20 = *local_108.d.ptr == sVar12;
              }
              else {
                bVar20 = false;
              }
            }
            if (!bVar5) {
              if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
              }
            }
            piVar3 = (int *)CONCAT71(local_f0.d.d._1_7_,local_f0.d.d._0_1_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT71(local_f0.d.d._1_7_,local_f0.d.d._0_1_),2,0x10);
              }
            }
            uVar19 = 1;
            if (!bVar20) {
              __return_storage_ptr__ = (uchar (*) [10])0x0;
              QLocale::QLocale((QLocale *)&local_d8,C,AnyScript,AnyCountry);
              bVar5 = QLocale::equals(this_00,(QLocale *)&local_d8);
              if (bVar5) {
LAB_003029a8:
                uVar19 = 0;
              }
              else {
                QLocale::groupSeparator(&local_150,this_00);
                QString::toLower_helper(&local_138,&local_150);
                if (local_138.d.size != 1) goto LAB_003029a8;
                __return_storage_ptr__ = (uchar (*) [10])(ulong)(uint)cVar7;
                uVar19 = (ulong)((uint)(*local_138.d.ptr == sVar12) * 2);
              }
              if (!bVar5) {
                if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_150.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_150.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              QLocale::~QLocale((QLocale *)&local_d8);
            }
          }
        }
      }
      QVar6.ucs = local_ba.ucs;
      if (uVar18 == 0x7c) {
        uVar13 = 0x7c;
LAB_00302a14:
        pQVar17 = this->string;
        if (pQVar17 == (QString *)0x0) {
          lVar1 = this->readBufferOffset;
          pQVar17 = &this->readBuffer;
          if (lVar1 == 0) goto LAB_00302aba;
          this->readBufferOffset = lVar1 + -1;
          pDVar2 = (this->readBuffer).d.d;
          if ((pDVar2 == (Data *)0x0) ||
             (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QString::reallocData(pQVar17,(this->readBuffer).d.size,KeepSize);
          }
          (this->readBuffer).d.ptr[lVar1 + -1] = QVar6.ucs;
        }
        else {
          lVar1 = this->stringOffset;
          if (lVar1 == 0) {
LAB_00302aba:
            QString::insert(pQVar17,0,local_ba);
          }
          else {
            this->stringOffset = lVar1 + -1;
            pDVar2 = (pQVar17->d).d;
            if ((pDVar2 == (Data *)0x0) ||
               (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QString::reallocData(pQVar17,(pQVar17->d).size,KeepSize);
            }
            (pQVar17->d).ptr[lVar1 + -1] = QVar6.ucs;
          }
        }
        bVar5 = 0x7b < uVar18;
        uVar18 = uVar13;
        if ((bVar5) && (bVar5 = getChar(this,&local_ba), bVar5)) {
          goto LAB_00302aed;
        }
        break;
      }
      __return_storage_ptr__ = getReal::table;
      pauVar4 = getReal::table + uVar15;
      uVar15 = (ulong)(*pauVar4)[uVar19];
      uVar13 = uVar18;
      if ((uVar15 == 0xd) || ((*pauVar4)[uVar19] == 0)) goto LAB_00302a14;
      __return_storage_ptr__ = (uchar (*) [10])0x0;
      if (0xff < (ushort)local_ba.ucs) {
        QVar6.ucs = L'\0';
      }
      *(char *)((long)&local_b8 + uVar18) = (char)QVar6.ucs;
      uVar18 = uVar18 + 1;
      bVar5 = getChar(this,&local_ba);
    } while (bVar5);
  }
  goto LAB_00302bd6;
  while (bVar5 = getChar(this,&local_ba), bVar5) {
LAB_00302aed:
    QVar6.ucs = local_ba.ucs;
    if ((9 < (ushort)local_ba.ucs - 0x30) &&
       (((ushort)local_ba.ucs < 0x80 ||
        (CVar8 = QChar::category((uint)(ushort)local_ba.ucs), CVar8 != Number_DecimalDigit)))) {
      pQVar17 = this->string;
      if (pQVar17 == (QString *)0x0) {
        lVar1 = this->readBufferOffset;
        pQVar17 = &this->readBuffer;
        if (lVar1 != 0) {
          this->readBufferOffset = lVar1 + -1;
          pDVar2 = (this->readBuffer).d.d;
          if ((pDVar2 == (Data *)0x0) ||
             (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QString::reallocData(pQVar17,(this->readBuffer).d.size,KeepSize);
          }
          (this->readBuffer).d.ptr[lVar1 + -1] = QVar6.ucs;
          break;
        }
      }
      else {
        lVar1 = this->stringOffset;
        if (lVar1 != 0) {
          this->stringOffset = lVar1 + -1;
          pDVar2 = (pQVar17->d).d;
          if ((pDVar2 == (Data *)0x0) ||
             (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QString::reallocData(pQVar17,(pQVar17->d).size,KeepSize);
          }
          (pQVar17->d).ptr[lVar1 + -1] = QVar6.ucs;
          break;
        }
      }
      QString::insert(pQVar17,0,QVar6);
      break;
    }
  }
LAB_00302bd6:
  if (uVar18 == 0) {
    uVar14 = 0;
  }
  else {
    uVar14 = 1;
    if (f != (double *)0x0) {
      *(undefined1 *)((long)&local_b8 + uVar18) = 0;
      iVar9 = qstricmp((char *)&local_b8,"nan");
      if (((iVar9 == 0) || (iVar9 = qstricmp((char *)&local_b8,"+nan"), iVar9 == 0)) ||
         (iVar9 = qstricmp((char *)&local_b8,"-nan"), iVar9 == 0)) {
        dVar11 = NAN;
      }
      else {
        iVar9 = qstricmp((char *)&local_b8,"+inf");
        if ((iVar9 == 0) || (iVar9 = qstricmp((char *)&local_b8,"inf"), iVar9 == 0)) {
          dVar11 = INFINITY;
        }
        else {
          iVar9 = qstricmp((char *)&local_b8,"-inf");
          if (iVar9 != 0) {
            local_f0.d.d._0_1_ = 0xaa;
            plVar10 = (long *)memchr(&local_b8,0,0x80);
            plVar16 = &local_38;
            if (plVar10 != (long *)0x0) {
              plVar16 = plVar10;
            }
            ba.m_data = (storage_type *)__return_storage_ptr__;
            ba.m_size = (qsizetype)&local_b8;
            QString::fromLatin1(&local_d8,(QString *)((long)plVar16 - (long)&local_b8),ba);
            s.m_data = local_d8.d.ptr;
            s.m_size = local_d8.d.size;
            dVar11 = QLocale::toDouble(&this->locale,s,(bool *)&local_f0);
            *f = dVar11;
            uVar14 = local_f0.d.d._0_1_;
            if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
                uVar14 = local_f0.d.d._0_1_;
              }
            }
            goto LAB_00302d3c;
          }
          dVar11 = -INFINITY;
        }
      }
      *f = dVar11;
    }
  }
LAB_00302d3c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar14;
  }
  __stack_chk_fail();
}

Assistant:

bool QTextStreamPrivate::getReal(double *f)
{
    // We use a table-driven FSM to parse floating point numbers
    // strtod() cannot be used directly since we may be reading from a
    // QIODevice.
    enum ParserState {
        Init = 0,
        Sign = 1,
        Mantissa = 2,
        Dot = 3,
        Abscissa = 4,
        ExpMark = 5,
        ExpSign = 6,
        Exponent = 7,
        Nan1 = 8,
        Nan2 = 9,
        Inf1 = 10,
        Inf2 = 11,
        NanInf = 12,
        Done = 13
    };
    enum InputToken {
        None = 0,
        InputSign = 1,
        InputDigit = 2,
        InputDot = 3,
        InputExp = 4,
        InputI = 5,
        InputN = 6,
        InputF = 7,
        InputA = 8,
        InputT = 9
    };

    static const uchar table[13][10] = {
        // None InputSign InputDigit InputDot InputExp InputI    InputN    InputF    InputA    InputT
        { 0,    Sign,     Mantissa,  Dot,     0,       Inf1,     Nan1,     0,        0,        0      }, // 0  Init
        { 0,    0,        Mantissa,  Dot,     0,       Inf1,     Nan1,     0,        0,        0      }, // 1  Sign
        { Done, Done,     Mantissa,  Dot,     ExpMark, 0,        0,        0,        0,        0      }, // 2  Mantissa
        { 0,    0,        Abscissa,  0,       0,       0,        0,        0,        0,        0      }, // 3  Dot
        { Done, Done,     Abscissa,  Done,    ExpMark, 0,        0,        0,        0,        0      }, // 4  Abscissa
        { 0,    ExpSign,  Exponent,  0,       0,       0,        0,        0,        0,        0      }, // 5  ExpMark
        { 0,    0,        Exponent,  0,       0,       0,        0,        0,        0,        0      }, // 6  ExpSign
        { Done, Done,     Exponent,  Done,    Done,    0,        0,        0,        0,        0      }, // 7  Exponent
        { 0,    0,        0,         0,       0,       0,        0,        0,        Nan2,     0      }, // 8  Nan1
        { 0,    0,        0,         0,       0,       0,        NanInf,   0,        0,        0      }, // 9  Nan2
        { 0,    0,        0,         0,       0,       0,        Inf2,     0,        0,        0      }, // 10 Inf1
        { 0,    0,        0,         0,       0,       0,        0,        NanInf,   0,        0      }, // 11 Inf2
        { Done, 0,        0,         0,       0,       0,        0,        0,        0,        0      }, // 11 NanInf
    };

    ParserState state = Init;
    InputToken input = None;

    scan(nullptr, nullptr, 0, NotSpace);
    consumeLastToken();

    const qsizetype BufferSize = 128;
    char buf[BufferSize];
    qsizetype i = 0;

    QChar c;
    while (getChar(&c)) {
        switch (c.unicode()) {
        case u'0': case u'1': case u'2': case u'3': case u'4':
        case u'5': case u'6': case u'7': case u'8': case u'9':
            input = InputDigit;
            break;
        case u'i': case u'I':
            input = InputI;
            break;
        case u'n': case u'N':
            input = InputN;
            break;
        case u'f': case u'F':
            input = InputF;
            break;
        case u'a': case u'A':
            input = InputA;
            break;
        case u't': case u'T':
            input = InputT;
            break;
        default: {
            QChar lc = c.toLower();
            if (lc == locale.decimalPoint().toLower())
                input = InputDot;
            else if (lc == locale.exponential().toLower())
                input = InputExp;
            else if (lc == locale.negativeSign().toLower()
                     || lc == locale.positiveSign().toLower())
                input = InputSign;
            else if (locale != QLocale::c() // backward-compatibility
                     && lc == locale.groupSeparator().toLower())
                input = InputDigit; // well, it isn't a digit, but no one cares.
            else
                input = None;
        }
            break;
        }

        state = ParserState(table[state][input]);

        if  (state == Init || state == Done || i > (BufferSize - 5)) {
            ungetChar(c);
            if (i > (BufferSize - 5)) { // ignore rest of digits
                while (getChar(&c)) {
                    if (!c.isDigit()) {
                        ungetChar(c);
                        break;
                    }
                }
            }
            break;
        }

        buf[i++] = c.toLatin1();
    }

    if (i == 0)
        return false;
    if (!f)
        return true;
    buf[i] = '\0';

    // backward-compatibility. Old implementation supported +nan/-nan
    // for some reason. QLocale only checks for lower-case
    // nan/+inf/-inf, so here we also check for uppercase and mixed
    // case versions.
    if (!qstricmp(buf, "nan") || !qstricmp(buf, "+nan") || !qstricmp(buf, "-nan")) {
        *f = qt_qnan();
        return true;
    } else if (!qstricmp(buf, "+inf") || !qstricmp(buf, "inf")) {
        *f = qt_inf();
        return true;
    } else if (!qstricmp(buf, "-inf")) {
        *f = -qt_inf();
        return true;
    }
    bool ok;
    *f = locale.toDouble(QString::fromLatin1(buf), &ok);
    return ok;
}